

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O0

PSNodeJoin * __thiscall
dg::pta::LLVMPointerGraphBuilder::createJoinNode
          (LLVMPointerGraphBuilder *this,CallInst *CInst,PSNode *callNode)

{
  PSNodeJoin *this_00;
  PSNode *in_RDX;
  vector<dg::pta::PSNodeJoin_*,_std::allocator<dg::pta::PSNodeJoin_*>_> *in_RSI;
  PSNodeJoin *joinNode;
  PSNode *in_stack_ffffffffffffffe0;
  
  PointerGraph::create<(dg::pta::PSNodeType)14>((PointerGraph *)in_stack_ffffffffffffffe0);
  this_00 = PSNodeJoin::get(in_stack_ffffffffffffffe0);
  PSNode::setPairedNode(in_RDX,&this_00->super_PSNode);
  PSNode::setPairedNode(&this_00->super_PSNode,in_RDX);
  PSNodeJoin::setCallInst(this_00,in_RDX);
  std::vector<dg::pta::PSNodeJoin_*,_std::allocator<dg::pta::PSNodeJoin_*>_>::push_back
            (in_RSI,(value_type *)in_RDX);
  addArgumentOperands(this,CInst,callNode);
  return this_00;
}

Assistant:

PSNodeJoin *LLVMPointerGraphBuilder::createJoinNode(const llvm::CallInst *CInst,
                                                    PSNode *callNode) {
    using namespace llvm;

    PSNodeJoin *joinNode = PSNodeJoin::get(PS.create<PSNodeType::JOIN>());
    callNode->setPairedNode(joinNode);
    joinNode->setPairedNode(callNode);

    joinNode->setCallInst(callNode);

    joinNodes.push_back(joinNode);
    addArgumentOperands(*CInst, *callNode);

    return joinNode;
}